

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

BSDF * __thiscall
pbrt::CoatedDiffuseMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (undefined8 param_1,ulong param_2,void *param_3,SpectrumTextureHandle *param_4,
          undefined1 (*param_5) [64],undefined8 *param_6,void *param_7)

{
  IdealDiffuseBxDF IVar1;
  DielectricInterfaceBxDF DVar2;
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  TextureEvalContext ctx_02;
  TextureEvalContext ctx_03;
  TextureEvalContext ctx_04;
  TextureEvalContext ctx_05;
  SampledWavelengths lambda;
  SampledWavelengths lambda_00;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  Float val;
  undefined1 auVar7 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  ulong uVar12;
  undefined1 auVar13 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  SampledSpectrum SVar14;
  Float gg;
  SampledSpectrum a;
  Float e;
  Float thick;
  TrowbridgeReitzDistribution distrib;
  Float vrough;
  Float urough;
  SampledSpectrum r;
  undefined1 auVar15 [16];
  undefined1 in_stack_fffffffffffffbc8 [64];
  undefined8 uVar17;
  undefined4 uVar18;
  Float eta;
  BxDFHandle *bxdf;
  Vector3f *dpdus;
  Normal3f *ns;
  Normal3f *n;
  Vector3f *wo;
  BSDF *this;
  FloatTextureHandle *in_stack_fffffffffffffc48;
  FloatTextureHandle *tex;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc54;
  int high;
  undefined8 in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  undefined8 in_stack_fffffffffffffc70;
  undefined8 in_stack_fffffffffffffc78;
  BSDF *pBVar19;
  undefined1 *puVar20;
  UniversalTextureEvaluator *in_stack_fffffffffffffca0;
  undefined2 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc2;
  undefined1 in_stack_fffffffffffffcc3 [17];
  undefined8 in_stack_fffffffffffffcd4;
  Float in_stack_fffffffffffffcdc;
  undefined1 in_stack_fffffffffffffce0 [32];
  undefined1 auVar21 [16];
  undefined1 in_stack_fffffffffffffd00 [24];
  undefined8 in_stack_fffffffffffffd18;
  FloatTextureHandle local_2a8;
  float local_29c;
  undefined8 local_298;
  undefined8 uStack_290;
  BxDFHandle *pBStack_288;
  Vector3f *pVStack_280;
  undefined1 local_278 [64];
  undefined1 local_230 [16];
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined1 local_208 [64];
  Normal3f local_1c8;
  Float local_1bc;
  undefined1 local_1b8 [64];
  Normal3f local_170;
  Float local_164;
  TrowbridgeReitzDistribution local_160;
  undefined1 local_158 [64];
  Float local_10c;
  undefined1 local_108 [64];
  Float local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [64];
  undefined1 local_58 [8];
  undefined8 local_50;
  undefined8 local_48;
  SampledSpectrum local_40;
  void *local_30;
  undefined8 *local_28;
  undefined1 (*local_20) [64];
  SpectrumTextureHandle *local_18;
  undefined1 local_9 [9];
  undefined1 auVar16 [32];
  
  puVar20 = local_58;
  pBVar19 = (BSDF *)param_3;
  local_30 = param_7;
  local_28 = param_6;
  local_20 = param_5;
  local_18 = param_4;
  local_9._1_8_ = param_3;
  SpectrumTextureHandle::SpectrumTextureHandle
            (in_stack_fffffffffffffbc8._8_8_,in_stack_fffffffffffffbc8._0_8_);
  auVar3 = vmovdqu64_avx512f(*local_20);
  local_98 = vmovdqu64_avx512f(auVar3);
  local_b8 = *local_28;
  uStack_b0 = local_28[1];
  uStack_a8 = local_28[2];
  uStack_a0 = local_28[3];
  auVar4 = vmovdqu64_avx512f(local_98);
  auVar3 = vmovdqu64_avx512f(auVar4);
  auVar15 = auVar3._0_16_;
  auVar7 = ZEXT856(auVar4._8_8_);
  auVar13 = ZEXT856(param_2);
  ctx_04.p.super_Tuple3<pbrt::Point3,_float>.x._2_1_ = in_stack_fffffffffffffcc2;
  ctx_04.p.super_Tuple3<pbrt::Point3,_float>.x._0_2_ = in_stack_fffffffffffffcc0;
  ctx_04._3_17_ = in_stack_fffffffffffffcc3;
  ctx_04.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (Float)in_stack_fffffffffffffcd4;
  ctx_04.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = SUB84(in_stack_fffffffffffffcd4,4);
  ctx_04.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffffcdc;
  ctx_04.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)in_stack_fffffffffffffce0._0_4_;
  ctx_04.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)in_stack_fffffffffffffce0._4_8_;
  ctx_04.uv.super_Tuple2<pbrt::Point2,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffce0._4_8_ >> 0x20);
  ctx_04.dudx = (Float)in_stack_fffffffffffffce0._12_4_;
  ctx_04.dudy = (Float)in_stack_fffffffffffffce0._16_4_;
  ctx_04.dvdx = (Float)in_stack_fffffffffffffce0._20_4_;
  ctx_04.dvdy = (Float)in_stack_fffffffffffffce0._24_4_;
  ctx_04.faceIndex = in_stack_fffffffffffffce0._28_4_;
  lambda.pdf.values[2] = (float)(int)in_stack_fffffffffffffd18;
  lambda.pdf.values[3] = (float)(int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  auVar21 = in_stack_fffffffffffffd00._0_16_;
  lambda.lambda.values[0] = (float)auVar21._0_4_;
  lambda.lambda.values[1] = (float)auVar21._4_4_;
  lambda.lambda.values[2] = (float)auVar21._8_4_;
  lambda.lambda.values[3] = (float)auVar21._12_4_;
  lambda.pdf.values[0] = (float)in_stack_fffffffffffffd00._16_4_;
  lambda.pdf.values[1] = (float)in_stack_fffffffffffffd00._20_4_;
  SVar14 = UniversalTextureEvaluator::operator()(in_stack_fffffffffffffca0,param_4,ctx_04,lambda);
  auVar8._0_8_ = SVar14.values.values._8_8_;
  auVar8._8_56_ = auVar13;
  auVar3._0_8_ = SVar14.values.values._0_8_;
  auVar3._8_56_ = auVar7;
  local_50 = vmovlpd_avx(auVar3._0_16_);
  local_48 = vmovlpd_avx(auVar8._0_16_);
  SVar14 = Clamp<int,int>(auVar15._8_8_,auVar15._4_4_,auVar15._0_4_);
  auVar9._0_8_ = SVar14.values.values._8_8_;
  auVar9._8_56_ = auVar13;
  auVar4._0_8_ = SVar14.values.values._0_8_;
  auVar4._8_56_ = auVar7;
  local_40.values.values._0_8_ = vmovlpd_avx(auVar4._0_16_);
  local_40.values.values._8_8_ = vmovlpd_avx(auVar9._0_16_);
  FloatTextureHandle::FloatTextureHandle(auVar15._8_8_,auVar15._0_8_);
  memcpy(local_108,local_20,0x40);
  auVar3 = vmovdqu64_avx512f(local_108);
  auVar3 = vmovdqu64_avx512f(auVar3);
  auVar15 = auVar3._0_16_;
  ctx.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffc68;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffc68 >> 0x20);
  ctx.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffc60;
  ctx.p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffc60 >> 0x20)
  ;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffc70;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)(int)((ulong)in_stack_fffffffffffffc70 >> 0x20);
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffc78;
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
  ctx._32_8_ = param_3;
  ctx._40_8_ = pBVar19;
  ctx._48_8_ = puVar20;
  ctx._56_8_ = param_4;
  local_bc = UniversalTextureEvaluator::operator()
                       ((UniversalTextureEvaluator *)
                        CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                        in_stack_fffffffffffffc48,ctx);
  FloatTextureHandle::FloatTextureHandle(auVar15._8_8_,auVar15._0_8_);
  memcpy(local_158,local_20,0x40);
  auVar3 = vmovdqu64_avx512f(local_158);
  auVar3 = vmovdqu64_avx512f(auVar3);
  auVar16 = auVar3._0_32_;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffc68;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffc68 >> 0x20);
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffc60;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffc70;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)(int)((ulong)in_stack_fffffffffffffc70 >> 0x20);
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffc78;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
  ctx_00._32_8_ = param_3;
  ctx_00._40_8_ = pBVar19;
  ctx_00._48_8_ = puVar20;
  ctx_00._56_8_ = param_4;
  local_10c = UniversalTextureEvaluator::operator()
                        ((UniversalTextureEvaluator *)
                         CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                         in_stack_fffffffffffffc48,ctx_00);
  if ((param_4[8].
       super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
       .bits & 1) != 0) {
    local_bc = TrowbridgeReitzDistribution::RoughnessToAlpha(0.0);
    local_10c = TrowbridgeReitzDistribution::RoughnessToAlpha(0.0);
  }
  auVar15 = auVar16._0_16_;
  TrowbridgeReitzDistribution::TrowbridgeReitzDistribution
            (auVar16._24_8_,auVar16._20_4_,auVar16._16_4_);
  ns = &local_170;
  FloatTextureHandle::FloatTextureHandle(auVar15._8_8_,auVar15._0_8_);
  auVar3 = vmovdqu64_avx512f(*local_20);
  local_1b8 = vmovdqu64_avx512f(auVar3);
  auVar3 = vmovdqu64_avx512f(local_1b8);
  auVar3 = vmovdqu64_avx512f(auVar3);
  auVar15 = auVar3._0_16_;
  this = (BSDF *)local_9;
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffc68;
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffc68 >> 0x20);
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffc60;
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffc70;
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)(int)((ulong)in_stack_fffffffffffffc70 >> 0x20);
  ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffc78;
  ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
  ctx_01._32_8_ = param_3;
  ctx_01._40_8_ = pBVar19;
  ctx_01._48_8_ = puVar20;
  ctx_01._56_8_ = param_4;
  local_164 = UniversalTextureEvaluator::operator()
                        ((UniversalTextureEvaluator *)
                         CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                         in_stack_fffffffffffffc48,ctx_01);
  n = &local_1c8;
  FloatTextureHandle::FloatTextureHandle(auVar15._8_8_,auVar15._0_8_);
  auVar3 = vmovdqu64_avx512f(*local_20);
  local_208 = vmovdqu64_avx512f(auVar3);
  auVar3 = vmovdqu64_avx512f(local_208);
  auVar3 = vmovdqu64_avx512f(auVar3);
  auVar15 = auVar3._0_16_;
  uVar12 = 0;
  ctx_02.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffc68;
  ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffc68 >> 0x20);
  ctx_02.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffc60;
  ctx_02.p.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
  ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffc70;
  ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)(int)((ulong)in_stack_fffffffffffffc70 >> 0x20);
  ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffc78;
  ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
  ctx_02._32_8_ = param_3;
  ctx_02._40_8_ = pBVar19;
  ctx_02._48_8_ = puVar20;
  ctx_02._56_8_ = param_4;
  local_1bc = UniversalTextureEvaluator::operator()
                        ((UniversalTextureEvaluator *)
                         CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                         in_stack_fffffffffffffc48,ctx_02);
  wo = (Vector3f *)local_230;
  SpectrumTextureHandle::SpectrumTextureHandle(auVar15._8_8_,auVar15._0_8_);
  auVar3 = vmovdqu64_avx512f(*local_20);
  local_278 = vmovdqu64_avx512f(auVar3);
  uVar17 = *local_28;
  uStack_290 = local_28[1];
  bxdf = (BxDFHandle *)local_28[2];
  dpdus = (Vector3f *)local_28[3];
  uVar18 = (undefined4)uStack_290;
  eta = (Float)((ulong)uStack_290 >> 0x20);
  auVar4 = vmovdqu64_avx512f(local_278);
  auVar3 = vmovdqu64_avx512f(auVar4);
  auVar15 = auVar3._0_16_;
  auVar7 = ZEXT856(auVar4._8_8_);
  auVar13 = ZEXT856(uVar12);
  ctx_05.p.super_Tuple3<pbrt::Point3,_float>.x._2_1_ = in_stack_fffffffffffffcc2;
  ctx_05.p.super_Tuple3<pbrt::Point3,_float>.x._0_2_ = in_stack_fffffffffffffcc0;
  ctx_05._3_17_ = in_stack_fffffffffffffcc3;
  ctx_05.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (Float)in_stack_fffffffffffffcd4;
  ctx_05.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = SUB84(in_stack_fffffffffffffcd4,4);
  ctx_05.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffffcdc;
  ctx_05.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)in_stack_fffffffffffffce0._0_4_;
  ctx_05.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)in_stack_fffffffffffffce0._4_8_;
  ctx_05.uv.super_Tuple2<pbrt::Point2,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffce0._4_8_ >> 0x20);
  ctx_05.dudx = (Float)in_stack_fffffffffffffce0._12_4_;
  ctx_05.dudy = (Float)in_stack_fffffffffffffce0._16_4_;
  ctx_05.dvdx = (Float)in_stack_fffffffffffffce0._20_4_;
  ctx_05.dvdy = (Float)in_stack_fffffffffffffce0._24_4_;
  ctx_05.faceIndex = in_stack_fffffffffffffce0._28_4_;
  lambda_00.pdf.values[2] = (float)(int)in_stack_fffffffffffffd18;
  lambda_00.pdf.values[3] = (float)(int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  auVar21 = in_stack_fffffffffffffd00._0_16_;
  lambda_00.lambda.values[0] = (float)auVar21._0_4_;
  lambda_00.lambda.values[1] = (float)auVar21._4_4_;
  lambda_00.lambda.values[2] = (float)auVar21._8_4_;
  lambda_00.lambda.values[3] = (float)auVar21._12_4_;
  lambda_00.pdf.values[0] = (float)in_stack_fffffffffffffd00._16_4_;
  lambda_00.pdf.values[1] = (float)in_stack_fffffffffffffd00._20_4_;
  local_298 = uVar17;
  pBStack_288 = bxdf;
  pVStack_280 = dpdus;
  SVar14 = UniversalTextureEvaluator::operator()(in_stack_fffffffffffffca0,param_4,ctx_05,lambda_00)
  ;
  auVar10._0_8_ = SVar14.values.values._8_8_;
  auVar10._8_56_ = auVar13;
  auVar5._0_8_ = SVar14.values.values._0_8_;
  auVar5._8_56_ = auVar7;
  local_230._8_8_ = vmovlpd_avx(auVar5._0_16_);
  local_220 = vmovlpd_avx(auVar10._0_16_);
  high = 1;
  SVar14 = Clamp<int,int>(auVar15._8_8_,auVar15._4_4_,auVar15._0_4_);
  auVar11._0_8_ = SVar14.values.values._8_8_;
  auVar11._8_56_ = auVar13;
  auVar6._0_8_ = SVar14.values.values._0_8_;
  auVar6._8_56_ = auVar7;
  local_218 = vmovlpd_avx(auVar6._0_16_);
  local_210 = vmovlpd_avx(auVar11._0_16_);
  tex = &local_2a8;
  FloatTextureHandle::FloatTextureHandle(auVar15._8_8_,auVar15._0_8_);
  auVar3 = vmovdqu64_avx512f(*local_20);
  auVar3 = vmovdqu64_avx512f(auVar3);
  auVar3 = vmovdqu64_avx512f(auVar3);
  auVar3 = vmovdqu64_avx512f(auVar3);
  ctx_03.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffc68;
  ctx_03.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffc68 >> 0x20);
  ctx_03.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffc60;
  ctx_03.p.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
  ctx_03.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffc70;
  ctx_03.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)(int)((ulong)in_stack_fffffffffffffc70 >> 0x20);
  ctx_03.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffc78;
  ctx_03.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
  ctx_03._32_8_ = param_3;
  ctx_03._40_8_ = pBVar19;
  ctx_03._48_8_ = puVar20;
  ctx_03._56_8_ = param_4;
  val = UniversalTextureEvaluator::operator()
                  ((UniversalTextureEvaluator *)CONCAT44(high,in_stack_fffffffffffffc50),tex,ctx_03)
  ;
  local_29c = Clamp<float,int,int>(val,-1,high);
  DielectricInterfaceBxDF::DielectricInterfaceBxDF
            ((DielectricInterfaceBxDF *)&stack0xfffffffffffffcd4,local_1bc,&local_160);
  IdealDiffuseBxDF::IdealDiffuseBxDF((IdealDiffuseBxDF *)&stack0xfffffffffffffcc4,&local_40);
  auVar15 = auVar3._0_16_;
  DVar2.mfDistrib.alpha_y = SUB84(n,0);
  DVar2._0_8_ = ns;
  IVar1.R.values.values[2] = (float)uVar18;
  IVar1.R.values.values[0] = (float)(int)uVar17;
  IVar1.R.values.values[1] = (float)(int)((ulong)uVar17 >> 0x20);
  IVar1.R.values.values[3] = eta;
  CoatedDiffuseBxDF::LayeredBxDF
            (auVar3._48_8_,DVar2,IVar1,auVar3._44_4_,auVar3._32_8_,auVar3._28_4_,auVar3._61_3_);
  memcpy(local_30,&stack0xfffffffffffffce0,0x37);
  BxDFHandle::TaggedPointer<pbrt::CoatedDiffuseBxDF>(auVar15._8_8_,auVar15._0_8_);
  BSDF::BSDF(this,wo,n,ns,dpdus,bxdf,eta);
  return pBVar19;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, const MaterialEvalContext &ctx,
                              SampledWavelengths &lambda, CoatedDiffuseBxDF *bxdf) const {
        // Initialize diffuse component of plastic material
        SampledSpectrum r = Clamp(texEval(reflectance, ctx, lambda), 0, 1);

        // Create microfacet distribution _distrib_ for coated diffuse material
        Float urough = texEval(uRoughness, ctx);
        Float vrough = texEval(vRoughness, ctx);
        if (remapRoughness) {
            urough = TrowbridgeReitzDistribution::RoughnessToAlpha(urough);
            vrough = TrowbridgeReitzDistribution::RoughnessToAlpha(vrough);
        }
        TrowbridgeReitzDistribution distrib(urough, vrough);

        Float thick = texEval(thickness, ctx);
        Float e = texEval(eta, ctx);
        SampledSpectrum a = Clamp(texEval(albedo, ctx, lambda), 0, 1);
        Float gg = Clamp(texEval(g, ctx), -1, 1);

        *bxdf = CoatedDiffuseBxDF(DielectricInterfaceBxDF(e, distrib),
                                  IdealDiffuseBxDF(r), thick, a, gg, config);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf);
    }